

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_entry_point_declarations(CompilerMSL *this)

{
  MSLSamplerMipFilter MVar1;
  MSLSamplerBorderColor MVar2;
  uint id;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  reference ppVar7;
  reference ppVar8;
  SPIRVariable **ppSVar9;
  SPIRType *pSVar10;
  SPIRType *pSVar11;
  CompilerError *pCVar12;
  mapped_type *pmVar13;
  uint *puVar14;
  SPIRVariable *pSVar15;
  pair<unsigned_int,_unsigned_int> *ppVar16;
  uint *__last;
  undefined1 local_c58 [40];
  SPIRVariable *var_5;
  uint *puStack_c28;
  uint32_t var_id_3;
  uint *__end1_5;
  uint *__begin1_5;
  SmallVector<unsigned_int,_8UL> *__range1_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8 [32];
  char *local_ba8;
  char *local_ba0;
  char *desc_addr_space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70 [32];
  char *local_b50;
  undefined1 local_b48 [8];
  string addr_space_1;
  SPIRType *type_4;
  SPIRVariable *var_4;
  uint32_t alias_id;
  uint32_t var_id_2;
  pair<unsigned_int,_unsigned_int> *var_pair;
  pair<unsigned_int,_unsigned_int> *__end1_4;
  pair<unsigned_int,_unsigned_int> *__begin1_4;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *__range1_4;
  char *local_ad0;
  spirv_cross local_ac8 [8];
  string alias_name;
  ID local_aa8;
  uint32_t local_aa4;
  ID local_aa0;
  uint32_t desc_binding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98 [4];
  uint32_t desc_set_1;
  string name_2;
  undefined1 local_a78 [8];
  string addr_space;
  SPIRType *type_3;
  SPIRVariable *var_3;
  uint *var_id_1;
  uint *__end1_3;
  uint *__begin1_3;
  SmallVector<unsigned_int,_8UL> *__range1_3;
  uint32_t i_1;
  uint32_t array_size_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18 [32];
  undefined1 local_9f8 [64];
  undefined1 local_9b8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958 [36];
  uint32_t local_934;
  string local_930 [8];
  string resource_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910 [8];
  string name_1;
  SPIRType *buffer_type;
  SPIRType *type_2;
  SPIRVariable *var_2;
  SPIRVariable *arg;
  SPIRVariable **__end1_2;
  SPIRVariable **__begin1_2;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0 [7];
  bool has_runtime_array_declaration;
  allocator local_889;
  string local_888 [32];
  string local_868 [32];
  undefined1 local_848 [64];
  char *local_808;
  undefined1 local_800 [72];
  undefined1 local_7b8 [40];
  undefined1 local_790 [79];
  allocator local_741;
  string local_740 [32];
  string local_720 [32];
  undefined1 local_700 [64];
  TypedID<(spirv_cross::Types)0> *local_6c0;
  undefined1 local_6b8 [72];
  undefined1 local_670 [40];
  uint32_t i;
  uint32_t array_size;
  char *local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620 [32];
  undefined1 local_600 [32];
  float local_5e0;
  uint32_t local_5dc;
  uint32_t base_index;
  uint32_t arg_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0 [4];
  uint32_t desc_set;
  string name;
  SPIRType *type_1;
  uint32_t var_id;
  SPIRVariable *var_1;
  pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_> *dynamic_buffer;
  iterator __end1_1;
  iterator __begin1_1;
  map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *__range1_1;
  undefined1 local_558 [32];
  undefined1 local_538 [32];
  undefined1 local_518 [32];
  undefined1 local_4f8 [64];
  spirv_cross local_4b8 [39];
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [55];
  allocator local_181;
  string local_180 [32];
  AlignedBuffer<unsigned_char,_8UL> local_160;
  MSLConstexprSampler *s;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  args;
  SPIRType *type;
  SPIRVariable *var;
  pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler> *samp;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
  *__range1;
  CompilerMSL *this_local;
  
  declare_complex_constant_arrays(this);
  __end1 = ::std::
           map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
           ::begin(&this->constexpr_samplers_by_id);
  samp = (pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler> *)
         ::std::
         map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
         ::end(&this->constexpr_samplers_by_id);
  do {
    bVar3 = ::std::operator!=(&__end1,(_Self *)&samp);
    if (!bVar3) {
      __end1_1 = ::std::
                 map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                 ::begin(&this->buffers_requiring_dynamic_offset);
      dynamic_buffer =
           (pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_> *)
           ::std::
           map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
           ::end(&this->buffers_requiring_dynamic_offset);
      do {
        bVar3 = ::std::operator!=(&__end1_1,(_Self *)&dynamic_buffer);
        if (!bVar3) {
          bVar3 = false;
          __end1_2 = VectorView<spirv_cross::SPIRVariable_*>::begin
                               (&(this->entry_point_bindings).
                                 super_VectorView<spirv_cross::SPIRVariable_*>);
          ppSVar9 = VectorView<spirv_cross::SPIRVariable_*>::end
                              (&(this->entry_point_bindings).
                                super_VectorView<spirv_cross::SPIRVariable_*>);
          do {
            if (__end1_2 == ppSVar9) {
              if (bVar3) {
                CompilerGLSL::statement_no_indent<char_const(&)[1]>
                          (&this->super_CompilerGLSL,(char (*) [1])0x400321);
              }
              __end1_3 = VectorView<unsigned_int>::begin
                                   (&(this->buffer_aliases_discrete).super_VectorView<unsigned_int>)
              ;
              puVar14 = VectorView<unsigned_int>::end
                                  (&(this->buffer_aliases_discrete).super_VectorView<unsigned_int>);
              for (; __end1_3 != puVar14; __end1_3 = __end1_3 + 1) {
                pSVar15 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,*__end1_3);
                pSVar10 = Compiler::get_variable_data_type((Compiler *)this,pSVar15);
                get_argument_address_space_abi_cxx11_((CompilerMSL *)local_a78,(SPIRVariable *)this)
                ;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (local_a98,this,(ulong)*__end1_3,1);
                TypedID<(spirv_cross::Types)0>::TypedID(&local_aa0,*__end1_3);
                desc_binding = Compiler::get_decoration
                                         ((Compiler *)this,local_aa0,DecorationDescriptorSet);
                TypedID<(spirv_cross::Types)0>::TypedID(&local_aa8,*__end1_3);
                local_aa4 = Compiler::get_decoration((Compiler *)this,local_aa8,DecorationBinding);
                join<char_const(&)[18],unsigned_int&,char_const(&)[8],unsigned_int&>
                          (local_ac8,(char (*) [18])"spvBufferAliasSet",&desc_binding,
                           (char (*) [8])"Binding",&local_aa4);
                local_ad0 = to_restrict(this,*__end1_3,true);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&__range1_4,this,pSVar10,0);
                CompilerGLSL::
                statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a78,(char (*) [8])" auto& ",&local_ad0,local_a98,
                           (char (*) [6])" = *(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a78,(char (*) [2])0x40c6cb,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range1_4,(char (*) [3])0x409a32,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_ac8,(char (*) [2])0x42463b);
                ::std::__cxx11::string::~string((string *)&__range1_4);
                ::std::__cxx11::string::~string((string *)local_ac8);
                ::std::__cxx11::string::~string((string *)local_a98);
                ::std::__cxx11::string::~string((string *)local_a78);
              }
              SmallVector<unsigned_int,_8UL>::clear(&this->buffer_aliases_discrete);
              __end1_4 = VectorView<std::pair<unsigned_int,_unsigned_int>_>::begin
                                   (&(this->buffer_aliases_argument).
                                     super_VectorView<std::pair<unsigned_int,_unsigned_int>_>);
              ppVar16 = VectorView<std::pair<unsigned_int,_unsigned_int>_>::end
                                  (&(this->buffer_aliases_argument).
                                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>);
              for (; __end1_4 != ppVar16; __end1_4 = __end1_4 + 1) {
                id = __end1_4->first;
                uVar6 = __end1_4->second;
                pSVar15 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,id);
                pSVar10 = Compiler::get_variable_data_type((Compiler *)this,pSVar15);
                get_argument_address_space_abi_cxx11_((CompilerMSL *)local_b48,(SPIRVariable *)this)
                ;
                bVar3 = VectorView<unsigned_int>::empty
                                  (&(pSVar10->array).super_VectorView<unsigned_int>);
                if (bVar3) {
                  local_b50 = to_restrict(this,id,true);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_b70,this,(ulong)id,1);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (local_b90,this,pSVar10,0);
                  TypedID<(spirv_cross::Types)0>::TypedID
                            ((TypedID<(spirv_cross::Types)0> *)((long)&desc_addr_space + 4),uVar6);
                  pmVar13 = ::std::
                            unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                            ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                         (key_type *)((long)&desc_addr_space + 4));
                  CompilerGLSL::
                  statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b48,(char (*) [8])" auto& ",&local_b50,local_b70,
                             (char (*) [5])0x421667,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b48,(char (*) [2])0x40c6cb,local_b90,(char (*) [3])0x40b41f,
                             &(pmVar13->decoration).qualified_alias,(char (*) [2])0x42463b);
                  ::std::__cxx11::string::~string((string *)local_b90);
                  ::std::__cxx11::string::~string((string *)local_b70);
                }
                else {
                  local_ba0 = descriptor_address_space(this,id,pSVar15->storage,"thread");
                  this->is_using_builtin_array = true;
                  local_ba8 = to_restrict(this,id,true);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_bc8,this,(ulong)id,1);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (local_be8,this,pSVar10,0);
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                            (local_c08,this,pSVar10,(ulong)id);
                  TypedID<(spirv_cross::Types)0>::TypedID
                            ((TypedID<(spirv_cross::Types)0> *)((long)&__range1_5 + 4),uVar6);
                  pmVar13 = ::std::
                            unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                            ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                         (key_type *)((long)&__range1_5 + 4));
                  CompilerGLSL::
                  statement<char_const*&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*&,char_const(&)[5],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,&local_ba0,(char (*) [8])" auto& ",&local_ba8
                             ,local_bc8,(char (*) [5])0x421667,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b48,(char (*) [2])0x40c6cb,local_be8,(char (*) [3])0x4245d4,
                             &local_ba0,(char (*) [5])" (&)",local_c08,(char (*) [2])0x40bd22,
                             &(pmVar13->decoration).qualified_alias,(char (*) [2])0x42463b);
                  ::std::__cxx11::string::~string((string *)local_c08);
                  ::std::__cxx11::string::~string((string *)local_be8);
                  ::std::__cxx11::string::~string((string *)local_bc8);
                  this->is_using_builtin_array = false;
                }
                ::std::__cxx11::string::~string((string *)local_b48);
              }
              puVar14 = VectorView<unsigned_int>::begin
                                  (&(this->disabled_frag_outputs).super_VectorView<unsigned_int>);
              __last = VectorView<unsigned_int>::end
                                 (&(this->disabled_frag_outputs).super_VectorView<unsigned_int>);
              ::std::sort<unsigned_int*>(puVar14,__last);
              __begin1_5 = (uint *)&this->disabled_frag_outputs;
              __end1_5 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin1_5);
              puStack_c28 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1_5);
              for (; __end1_5 != puStack_c28; __end1_5 = __end1_5 + 1) {
                var_5._4_4_ = *__end1_5;
                local_c58._32_8_ =
                     Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_5._4_4_);
                CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,var_5._4_4_);
                CompilerGLSL::variable_decl_abi_cxx11_
                          ((CompilerGLSL *)local_c58,(SPIRVariable *)this);
                CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
                          (&this->super_CompilerGLSL,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c58,(char (*) [2])0x42463b);
                ::std::__cxx11::string::~string((string *)local_c58);
                *(bool *)(local_c58._32_8_ + 0x98) = false;
              }
              if ((((this->super_CompilerGLSL).processing_entry_point & 1U) != 0) &&
                 (bVar3 = is_mesh_shader(this), bVar3)) {
                CompilerGLSL::statement<char_const(&)[32]>
                          (&this->super_CompilerGLSL,
                           (char (*) [32])"threadgroup uint2 spvMeshSizes;");
              }
              return;
            }
            pSVar15 = *__end1_2;
            pSVar10 = Compiler::get_variable_data_type((Compiler *)this,pSVar15);
            pSVar11 = Compiler::get_variable_element_type((Compiler *)this,pSVar15);
            uVar6 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar15->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_910,this,(ulong)uVar6,1);
            bVar4 = is_var_runtime_size_array(this,pSVar15);
            if (bVar4) {
              if ((int)(this->msl_options).argument_buffers_tier < 1) {
                pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (pCVar12,"Unsized array of descriptors requires argument buffer tier 2");
                __cxa_throw(pCVar12,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              ::std::__cxx11::string::string(local_930);
              local_934 = (pSVar15->super_IVariant).self.id;
              uVar6 = Compiler::get_decoration
                                ((Compiler *)this,(ID)local_934,DecorationDescriptorSet);
              bVar3 = descriptor_set_is_argument_buffer(this,uVar6);
              if (bVar3) {
                pmVar13 = ::std::
                          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                          ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                       &(pSVar15->super_IVariant).self);
                ::std::__cxx11::string::operator=
                          (local_930,(string *)&(pmVar13->decoration).qualified_alias);
              }
              else {
                ::std::operator+(local_958,(char *)local_910);
                ::std::__cxx11::string::operator=(local_930,(string *)local_958);
                ::std::__cxx11::string::~string((string *)local_958);
              }
              switch(pSVar10->basetype) {
              case Struct:
                get_argument_address_space_abi_cxx11_((CompilerMSL *)local_9b8,(SPIRVariable *)this)
                ;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_9f8 + 0x20,this,pSVar11,0);
                CompilerGLSL::
                statement<char_const(&)[20],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_9b8,(char (*) [2])0x40c6cb,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_9f8 + 0x20),(char (*) [4])"*> ",local_910,(char (*) [3])0x410cdc,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_930,(char (*) [3])0x418a1a);
                ::std::__cxx11::string::~string((string *)(local_9f8 + 0x20));
                ::std::__cxx11::string::~string((string *)local_9b8);
                break;
              case Image:
              case Sampler:
              case AccelerationStructure:
                uVar6 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar15->super_IVariant).self);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_978,this,pSVar11,(ulong)uVar6);
                CompilerGLSL::
                statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",local_978,
                           (char (*) [3])0x40ac61,local_910,(char (*) [3])0x410cdc,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_930,(char (*) [3])0x418a1a);
                ::std::__cxx11::string::~string((string *)local_978);
                break;
              case SampledImage:
                uVar6 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar15->super_IVariant).self);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_9b8 + 0x20,this,pSVar11,(ulong)uVar6);
                CompilerGLSL::
                statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                          (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_9b8 + 0x20),(char (*) [3])0x40ac61,local_910,
                           (char (*) [3])0x410cdc,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_930,(char (*) [3])0x418a1a);
                ::std::__cxx11::string::~string((string *)(local_9b8 + 0x20));
                CompilerGLSL::
                statement<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string_const&,char_const(&)[9]>
                          (&this->super_CompilerGLSL,(char (*) [29])"spvDescriptorArray<sampler> ",
                           local_910,(char (*) [8])"Smplr {",local_910,(char (*) [9])"Smplr_};");
              }
              bVar3 = true;
              ::std::__cxx11::string::~string(local_930);
            }
            else {
              bVar4 = VectorView<unsigned_int>::empty
                                (&(pSVar10->array).super_VectorView<unsigned_int>);
              if ((!bVar4) && (pSVar10->basetype == Struct)) {
                get_argument_address_space_abi_cxx11_((CompilerMSL *)local_9f8,(SPIRVariable *)this)
                ;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_a18,this,pSVar11,0);
                uVar6 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar15->super_IVariant).self);
                _i_1 = to_restrict(this,uVar6,true);
                CompilerGLSL::
                statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string_const&,char_const(&)[5]>
                          (&this->super_CompilerGLSL,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_9f8,(char (*) [2])0x40c6cb,local_a18,(char (*) [3])0x4245d4,
                           (char **)&i_1,local_910,(char (*) [5])"[] =");
                ::std::__cxx11::string::~string((string *)local_a18);
                ::std::__cxx11::string::~string((string *)local_9f8);
                CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
                uVar6 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSVar15->super_IVariant).self);
                __range1_3._4_4_ = get_resource_array_size(this,pSVar10,uVar6);
                for (__range1_3._0_4_ = 0; (uint)__range1_3 < __range1_3._4_4_;
                    __range1_3._0_4_ = (uint)__range1_3 + 1) {
                  CompilerGLSL::
                  statement<std::__cxx11::string_const&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                            (&this->super_CompilerGLSL,local_910,(char (*) [2])0x40fecd,
                             (uint *)&__range1_3,(char (*) [2])0x41622e);
                }
                CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
                CompilerGLSL::statement_no_indent<char_const(&)[1]>
                          (&this->super_CompilerGLSL,(char (*) [1])0x400321);
              }
            }
            ::std::__cxx11::string::~string((string *)local_910);
            __end1_2 = __end1_2 + 1;
          } while( true );
        }
        ppVar8 = ::std::
                 _Rb_tree_iterator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator*(&__end1_1);
        if ((ppVar8->second).second != 0) {
          pSVar15 = Compiler::get<spirv_cross::SPIRVariable>
                              ((Compiler *)this,(ppVar8->second).second);
          uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar15->super_IVariant).self)
          ;
          pSVar10 = Compiler::get_variable_data_type((Compiler *)this,pSVar15);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar15->super_IVariant).self)
          ;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_5d0,this,(ulong)uVar5,1);
          base_index = (pSVar15->super_IVariant).self.id;
          arg_id = Compiler::get_decoration((Compiler *)this,(ID)base_index,DecorationDescriptorSet)
          ;
          local_5dc = this->argument_buffer_ids[arg_id];
          local_5e0 = (float)(ppVar8->second).first;
          bVar3 = Compiler::is_array((Compiler *)this,pSVar10);
          if (bVar3) {
            this->is_using_builtin_array = true;
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_600,(SPIRVariable *)this);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (local_620,this,pSVar10,0);
            local_628 = to_restrict(this,uVar6,true);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                      (&i,this,pSVar10,(ulong)uVar6);
            CompilerGLSL::
            statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string&,std::__cxx11::string,char_const(&)[3]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_600,(char (*) [2])0x40c6cb,local_620,(char (*) [3])0x4245d4,&local_628,
                       local_5d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       (char (*) [3])0x4162c3);
            ::std::__cxx11::string::~string((string *)&i);
            ::std::__cxx11::string::~string((string *)local_620);
            ::std::__cxx11::string::~string((string *)local_600);
            local_670._36_4_ = get_resource_array_size(this,pSVar10,uVar6);
            if (local_670._36_4_ == 0) {
              pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar12,
                         "Size of runtime array with dynamic offset could not be determined from resource bindings."
                        );
              __cxa_throw(pCVar12,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
            for (local_670._32_4_ = 0; (uint)local_670._32_4_ < (uint)local_670._36_4_;
                local_670._32_4_ = local_670._32_4_ + 1) {
              get_argument_address_space_abi_cxx11_((CompilerMSL *)local_670,(SPIRVariable *)this);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (local_6b8 + 0x28,this,pSVar10,0);
              local_6b8._32_8_ = to_restrict(this,uVar6,false);
              get_argument_address_space_abi_cxx11_((CompilerMSL *)local_6b8,(SPIRVariable *)this);
              local_6c0 = (TypedID<(spirv_cross::Types)0> *)to_restrict(this,uVar6,false);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_700 + 0x20,this,(ulong)local_5dc,1);
              ::std::__cxx11::string::string(local_720,(string *)local_5d0);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_740,"m",&local_741);
              ensure_valid_name((CompilerMSL *)local_700,(string *)this,(string *)local_720);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_790 + 0x28,this,(ulong)this->dynamic_offsets_buffer_id,1);
              local_790._36_4_ = (int)local_5e0 + local_670._32_4_;
              CompilerGLSL::
              statement<char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int,char_const(&)[4]>
                        (&this->super_CompilerGLSL,(char (*) [2])0x422b6e,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_670,(char (*) [2])0x40c6cb,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_6b8 + 0x28),(char (*) [3])0x4245d4,(char **)(local_6b8 + 0x20),
                         (char (*) [4])")((",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6b8,(char (*) [8])" char* ",(char **)&local_6c0,
                         (char (*) [2])0x40bd22,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_700 + 0x20),(char (*) [2])0x40b926,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_700,(char (*) [2])0x40f992,(uint *)(local_670 + 0x20),
                         (char (*) [2])0x40f897,(char (*) [4])0x4181fc,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_790 + 0x28),(char (*) [2])0x40f992,(uint *)(local_790 + 0x24),
                         (char (*) [4])"]),");
              ::std::__cxx11::string::~string((string *)(local_790 + 0x28));
              ::std::__cxx11::string::~string((string *)local_700);
              ::std::__cxx11::string::~string(local_740);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_741);
              ::std::__cxx11::string::~string(local_720);
              ::std::__cxx11::string::~string((string *)(local_700 + 0x20));
              ::std::__cxx11::string::~string((string *)local_6b8);
              ::std::__cxx11::string::~string((string *)(local_6b8 + 0x28));
              ::std::__cxx11::string::~string((string *)local_670);
            }
            CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
            CompilerGLSL::statement_no_indent<char_const(&)[1]>
                      (&this->super_CompilerGLSL,(char (*) [1])0x400321);
            this->is_using_builtin_array = false;
          }
          else {
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_790,(SPIRVariable *)this);
            local_7b8._32_8_ = to_restrict(this,uVar6,true);
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_7b8,(SPIRVariable *)this);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (local_800 + 0x28,this,pSVar10,0);
            local_800._32_8_ = to_restrict(this,uVar6,false);
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_800,(SPIRVariable *)this);
            local_808 = to_restrict(this,uVar6,false);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_848 + 0x20,this,(ulong)local_5dc,1);
            ::std::__cxx11::string::string(local_868,(string *)local_5d0);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_888,"m",&local_889);
            ensure_valid_name((CompilerMSL *)local_848,(string *)this,(string *)local_868);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_8b0,this,(ulong)this->dynamic_offsets_buffer_id,1);
            CompilerGLSL::
            statement<std::__cxx11::string,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
                      (&this->super_CompilerGLSL,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_790,(char (*) [8])" auto& ",(char **)(local_7b8 + 0x20),local_5d0,
                       (char (*) [6])" = *(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7b8,(char (*) [2])0x40c6cb,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_800 + 0x28),(char (*) [3])0x4245d4,(char **)(local_800 + 0x20),
                       (char (*) [4])")((",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_800,(char (*) [8])" char* ",&local_808,(char (*) [2])0x40bd22,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_848 + 0x20),(char (*) [2])0x40b926,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_848,(char (*) [4])0x4181fc,local_8b0,(char (*) [2])0x40f992,
                       (uint *)&local_5e0,(char (*) [4])0x40e54c);
            ::std::__cxx11::string::~string((string *)local_8b0);
            ::std::__cxx11::string::~string((string *)local_848);
            ::std::__cxx11::string::~string(local_888);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_889);
            ::std::__cxx11::string::~string(local_868);
            ::std::__cxx11::string::~string((string *)(local_848 + 0x20));
            ::std::__cxx11::string::~string((string *)local_800);
            ::std::__cxx11::string::~string((string *)(local_800 + 0x28));
            ::std::__cxx11::string::~string((string *)local_7b8);
            ::std::__cxx11::string::~string((string *)local_790);
          }
          ::std::__cxx11::string::~string((string *)local_5d0);
        }
        ::std::
        _Rb_tree_iterator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>
        ::operator++(&__end1_1);
      } while( true );
    }
    ppVar7 = ::std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>::
             operator*(&__end1);
    pSVar15 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ppVar7->first);
    uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar15->super_IVariant).field_0xc);
    args.stack_storage.aligned_char._248_8_ =
         Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
    if (((SPIRType *)args.stack_storage.aligned_char._248_8_)->basetype == Sampler) {
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,ppVar7->first);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s);
    local_160.aligned_char = (char  [8])&ppVar7->second;
    if (((MSLConstexprSampler *)local_160.aligned_char)->coord != MSL_SAMPLER_COORD_NORMALIZED) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_180,"coord::pixel",&local_181);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_180);
      ::std::__cxx11::string::~string(local_180);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
    }
    if (*(MSLSamplerFilter *)((long)local_160.aligned_char + 4) ==
        *(MSLSamplerFilter *)((long)local_160.aligned_char + 8)) {
      if (*(MSLSamplerFilter *)((long)local_160.aligned_char + 4) != MSL_SAMPLER_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1b8,"filter::linear",&local_1b9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b8);
        ::std::__cxx11::string::~string(local_1b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
    }
    else {
      if (*(MSLSamplerFilter *)((long)local_160.aligned_char + 4) != MSL_SAMPLER_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1e0,"min_filter::linear",&local_1e1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1e0);
        ::std::__cxx11::string::~string(local_1e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      }
      if (*(MSLSamplerFilter *)((long)local_160.aligned_char + 8) != MSL_SAMPLER_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_208,"mag_filter::linear",&local_209);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_208);
        ::std::__cxx11::string::~string(local_208);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
      }
    }
    MVar1 = *(MSLSamplerMipFilter *)((long)local_160.aligned_char + 0xc);
    if (MVar1 != MSL_SAMPLER_MIP_FILTER_NONE) {
      if (MVar1 == MSL_SAMPLER_MIP_FILTER_NEAREST) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_230,"mip_filter::nearest",&local_231);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_230);
        ::std::__cxx11::string::~string(local_230);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      }
      else {
        if (MVar1 != MSL_SAMPLER_MIP_FILTER_LINEAR) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar12,"Invalid mip filter.");
          __cxa_throw(pCVar12,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_258,"mip_filter::linear",&local_259);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_258);
        ::std::__cxx11::string::~string(local_258);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
      }
    }
    if ((*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x10) ==
         *(MSLSamplerAddress *)((long)local_160.aligned_char + 0x14)) &&
       (*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x10) ==
        *(MSLSamplerAddress *)((long)local_160.aligned_char + 0x18))) {
      if (*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x10) !=
          MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_((char *)local_280,0x400321);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,local_280);
        ::std::__cxx11::string::~string((string *)local_280);
      }
    }
    else {
      if (*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x10) !=
          MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_((char *)local_2a0,0x416057);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,local_2a0);
        ::std::__cxx11::string::~string((string *)local_2a0);
      }
      if (*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x14) !=
          MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_((char *)local_2c0,0x40f7d0);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,local_2c0);
        ::std::__cxx11::string::~string((string *)local_2c0);
      }
      if (*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x18) !=
          MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
        create_sampler_address_abi_cxx11_((char *)local_2e0,0x4124d9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,local_2e0);
        ::std::__cxx11::string::~string((string *)local_2e0);
      }
    }
    if ((*(bool *)((long)local_160.aligned_char + 0x60) & 1U) != 0) {
      switch(*(MSLSamplerCompareFunc *)((long)local_160.aligned_char + 0x1c)) {
      case MSL_SAMPLER_COMPARE_FUNC_NEVER:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_328,"compare_func::never",&local_329);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_328);
        ::std::__cxx11::string::~string(local_328);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_LESS:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3a0,"compare_func::less",&local_3a1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3a0);
        ::std::__cxx11::string::~string(local_3a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_LESS_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3c8,"compare_func::less_equal",&local_3c9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3c8);
        ::std::__cxx11::string::~string(local_3c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_GREATER:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3f0,"compare_func::greater",&local_3f1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3f0);
        ::std::__cxx11::string::~string(local_3f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_GREATER_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_418,"compare_func::greater_equal",&local_419);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_418);
        ::std::__cxx11::string::~string(local_418);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_350,"compare_func::equal",&local_351);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_350);
        ::std::__cxx11::string::~string(local_350);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_NOT_EQUAL:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_378,"compare_func::not_equal",&local_379);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_378);
        ::std::__cxx11::string::~string(local_378);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
        break;
      case MSL_SAMPLER_COMPARE_FUNC_ALWAYS:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_300,"compare_func::always",&local_301);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_300);
        ::std::__cxx11::string::~string(local_300);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_301);
        break;
      default:
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar12,"Invalid sampler compare function.");
        __cxa_throw(pCVar12,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    if (((*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x10) ==
          MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER) ||
        (*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x14) ==
         MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)) ||
       (*(MSLSamplerAddress *)((long)local_160.aligned_char + 0x18) ==
        MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)) {
      MVar2 = *(MSLSamplerBorderColor *)((long)local_160.aligned_char + 0x20);
      if (MVar2 == MSL_SAMPLER_BORDER_COLOR_TRANSPARENT_BLACK) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_490,"border_color::transparent_black",&local_491);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_490);
        ::std::__cxx11::string::~string(local_490);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_491);
      }
      else if (MVar2 == MSL_SAMPLER_BORDER_COLOR_OPAQUE_BLACK) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_440,"border_color::opaque_black",&local_441);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_440);
        ::std::__cxx11::string::~string(local_440);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_441);
      }
      else {
        if (MVar2 != MSL_SAMPLER_BORDER_COLOR_OPAQUE_WHITE) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar12,"Invalid sampler border color.");
          __cxa_throw(pCVar12,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_468,"border_color::opaque_white",&local_469);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_468);
        ::std::__cxx11::string::~string(local_468);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_469);
      }
    }
    if ((*(bool *)((long)local_160.aligned_char + 0x62) & 1U) != 0) {
      join<char_const(&)[16],int&,char_const(&)[2]>
                (local_4b8,(char (*) [16])"max_anisotropy(",
                 (int *)((long)local_160.aligned_char + 0x2c),(char (*) [2])0x40bd22);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4b8);
      ::std::__cxx11::string::~string((string *)local_4b8);
    }
    if ((*(bool *)((long)local_160.aligned_char + 0x61) & 1U) != 0) {
      CompilerGLSL::format_float_abi_cxx11_
                ((CompilerGLSL *)local_4f8,*(float *)((long)local_160.aligned_char + 0x24));
      CompilerGLSL::format_float_abi_cxx11_
                ((CompilerGLSL *)local_518,*(float *)((long)local_160.aligned_char + 0x28));
      join<char_const(&)[11],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)(local_4f8 + 0x20),(char (*) [11])0x4212e5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
                 (char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518,
                 (char (*) [2])0x40bd22);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_4f8 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_4f8 + 0x20));
      ::std::__cxx11::string::~string((string *)local_518);
      ::std::__cxx11::string::~string((string *)local_4f8);
    }
    bVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&s);
    if (bVar3) {
      if (*(int *)(args.stack_storage.aligned_char._248_8_ + 0x10) == 0x11) {
        to_sampler_expression_abi_cxx11_((CompilerMSL *)local_538,(uint32_t)this);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_538,this,(ulong)ppVar7->first,1);
      }
      CompilerGLSL::statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_538);
    }
    else {
      if (*(int *)(args.stack_storage.aligned_char._248_8_ + 0x10) == 0x11) {
        to_sampler_expression_abi_cxx11_((CompilerMSL *)local_558,(uint32_t)this);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_558,this,(ulong)ppVar7->first,1);
      }
      merge((spirv_cross *)&__range1_1,
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)&s,", ");
      CompilerGLSL::
      statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                 (char (*) [2])0x422b6e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1,
                 (char (*) [3])0x40acad);
      ::std::__cxx11::string::~string((string *)&__range1_1);
      ::std::__cxx11::string::~string((string *)local_558);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                    *)&s);
    ::std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void CompilerMSL::emit_entry_point_declarations()
{
	// FIXME: Get test coverage here ...
	// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries
	declare_complex_constant_arrays();

	// Emit constexpr samplers here.
	for (auto &samp : constexpr_samplers_by_id)
	{
		auto &var = get<SPIRVariable>(samp.first);
		auto &type = get<SPIRType>(var.basetype);
		if (type.basetype == SPIRType::Sampler)
			add_resource_name(samp.first);

		SmallVector<string> args;
		auto &s = samp.second;

		if (s.coord != MSL_SAMPLER_COORD_NORMALIZED)
			args.push_back("coord::pixel");

		if (s.min_filter == s.mag_filter)
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("filter::linear");
		}
		else
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("min_filter::linear");
			if (s.mag_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("mag_filter::linear");
		}

		switch (s.mip_filter)
		{
		case MSL_SAMPLER_MIP_FILTER_NONE:
			// Default
			break;
		case MSL_SAMPLER_MIP_FILTER_NEAREST:
			args.push_back("mip_filter::nearest");
			break;
		case MSL_SAMPLER_MIP_FILTER_LINEAR:
			args.push_back("mip_filter::linear");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid mip filter.");
		}

		if (s.s_address == s.t_address && s.s_address == s.r_address)
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("", s.s_address));
		}
		else
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("s_", s.s_address));
			if (s.t_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("t_", s.t_address));
			if (s.r_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("r_", s.r_address));
		}

		if (s.compare_enable)
		{
			switch (s.compare_func)
			{
			case MSL_SAMPLER_COMPARE_FUNC_ALWAYS:
				args.push_back("compare_func::always");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NEVER:
				args.push_back("compare_func::never");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_EQUAL:
				args.push_back("compare_func::equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NOT_EQUAL:
				args.push_back("compare_func::not_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS:
				args.push_back("compare_func::less");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS_EQUAL:
				args.push_back("compare_func::less_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER:
				args.push_back("compare_func::greater");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER_EQUAL:
				args.push_back("compare_func::greater_equal");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler compare function.");
			}
		}

		if (s.s_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER || s.t_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER ||
		    s.r_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)
		{
			switch (s.border_color)
			{
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_BLACK:
				args.push_back("border_color::opaque_black");
				break;
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_WHITE:
				args.push_back("border_color::opaque_white");
				break;
			case MSL_SAMPLER_BORDER_COLOR_TRANSPARENT_BLACK:
				args.push_back("border_color::transparent_black");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler border color.");
			}
		}

		if (s.anisotropy_enable)
			args.push_back(join("max_anisotropy(", s.max_anisotropy, ")"));
		if (s.lod_clamp_enable)
		{
			args.push_back(join("lod_clamp(", format_float(s.lod_clamp_min), ", ", format_float(s.lod_clamp_max), ")"));
		}

		// If we would emit no arguments, then omit the parentheses entirely. Otherwise,
		// we'll wind up with a "most vexing parse" situation.
		if (args.empty())
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          ";");
		else
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          "(", merge(args), ");");
	}

	// Emit dynamic buffers here.
	for (auto &dynamic_buffer : buffers_requiring_dynamic_offset)
	{
		if (!dynamic_buffer.second.second)
		{
			// Could happen if no buffer was used at requested binding point.
			continue;
		}

		const auto &var = get<SPIRVariable>(dynamic_buffer.second.second);
		uint32_t var_id = var.self;
		const auto &type = get_variable_data_type(var);
		string name = to_name(var.self);
		uint32_t desc_set = get_decoration(var.self, DecorationDescriptorSet);
		uint32_t arg_id = argument_buffer_ids[desc_set];
		uint32_t base_index = dynamic_buffer.second.first;

		if (is_array(type))
		{
			is_using_builtin_array = true;
			statement(get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, true), name,
			          type_to_array_glsl(type, var_id), " =");

			uint32_t array_size = get_resource_array_size(type, var_id);
			if (array_size == 0)
				SPIRV_CROSS_THROW("Size of runtime array with dynamic offset could not be determined from resource bindings.");

			begin_scope();

			for (uint32_t i = 0; i < array_size; i++)
			{
				statement("(", get_argument_address_space(var), " ", type_to_glsl(type), "* ",
				          to_restrict(var_id, false), ")((", get_argument_address_space(var), " char* ",
				          to_restrict(var_id, false), ")", to_name(arg_id), ".", ensure_valid_name(name, "m"),
				          "[", i, "]", " + ", to_name(dynamic_offsets_buffer_id), "[", base_index + i, "]),");
			}

			end_scope_decl();
			statement_no_indent("");
			is_using_builtin_array = false;
		}
		else
		{
			statement(get_argument_address_space(var), " auto& ", to_restrict(var_id, true), name, " = *(",
			          get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, false), ")((",
			          get_argument_address_space(var), " char* ", to_restrict(var_id, false), ")", to_name(arg_id), ".",
			          ensure_valid_name(name, "m"), " + ", to_name(dynamic_offsets_buffer_id), "[", base_index, "]);");
		}
	}

	bool has_runtime_array_declaration = false;
	for (SPIRVariable *arg : entry_point_bindings)
	{
		const auto &var = *arg;
		const auto &type = get_variable_data_type(var);
		const auto &buffer_type = get_variable_element_type(var);
		const string name = to_name(var.self);

		if (is_var_runtime_size_array(var))
		{
			if (msl_options.argument_buffers_tier < Options::ArgumentBuffersTier::Tier2)
			{
				SPIRV_CROSS_THROW("Unsized array of descriptors requires argument buffer tier 2");
			}

			string resource_name;
			if (descriptor_set_is_argument_buffer(get_decoration(var.self, DecorationDescriptorSet)))
				resource_name = ir.meta[var.self].decoration.qualified_alias;
			else
				resource_name = name + "_";

			switch (type.basetype)
			{
			case SPIRType::Image:
			case SPIRType::Sampler:
			case SPIRType::AccelerationStructure:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				break;
			case SPIRType::SampledImage:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				// Unsupported with argument buffer for now.
				statement("spvDescriptorArray<sampler> ", name, "Smplr {", name, "Smplr_};");
				break;
			case SPIRType::Struct:
				statement("spvDescriptorArray<", get_argument_address_space(var), " ", type_to_glsl(buffer_type), "*> ",
				          name, " {", resource_name, "};");
				break;
			default:
				break;
			}
			has_runtime_array_declaration = true;
		}
		else if (!type.array.empty() && type.basetype == SPIRType::Struct)
		{
			// Emit only buffer arrays here.
			statement(get_argument_address_space(var), " ", type_to_glsl(buffer_type), "* ",
			          to_restrict(var.self, true), name, "[] =");
			begin_scope();
			uint32_t array_size = get_resource_array_size(type, var.self);
			for (uint32_t i = 0; i < array_size; ++i)
				statement(name, "_", i, ",");
			end_scope_decl();
			statement_no_indent("");
		}
	}

	if (has_runtime_array_declaration)
		statement_no_indent("");

	// Emit buffer aliases here.
	for (auto &var_id : buffer_aliases_discrete)
	{
		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);
		auto name = to_name(var_id);

		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		uint32_t desc_binding = get_decoration(var_id, DecorationBinding);
		auto alias_name = join("spvBufferAliasSet", desc_set, "Binding", desc_binding);

		statement(addr_space, " auto& ", to_restrict(var_id, true),
		          name,
		          " = *(", addr_space, " ", type_to_glsl(type), "*)", alias_name, ";");
	}
	// Discrete descriptors are processed in entry point emission every compiler iteration.
	buffer_aliases_discrete.clear();

	for (auto &var_pair : buffer_aliases_argument)
	{
		uint32_t var_id = var_pair.first;
		uint32_t alias_id = var_pair.second;

		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);

		if (type.array.empty())
		{
			statement(addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "&)", ir.meta[alias_id].decoration.qualified_alias, ";");
		}
		else
		{
			const char *desc_addr_space = descriptor_address_space(var_id, var.storage, "thread");

			// Esoteric type cast. Reference to array of pointers.
			// Auto here defers to UBO or SSBO. The address space of the reference needs to refer to the
			// address space of the argument buffer itself, which is usually constant, but can be const device for
			// large argument buffers.
			is_using_builtin_array = true;
			statement(desc_addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "* ", desc_addr_space, " (&)",
			          type_to_array_glsl(type, var_id), ")", ir.meta[alias_id].decoration.qualified_alias, ";");
			is_using_builtin_array = false;
		}
	}

	// Emit disabled fragment outputs.
	std::sort(disabled_frag_outputs.begin(), disabled_frag_outputs.end());
	for (uint32_t var_id : disabled_frag_outputs)
	{
		auto &var = get<SPIRVariable>(var_id);
		add_local_variable_name(var_id);
		statement(CompilerGLSL::variable_decl(var), ";");
		var.deferred_declaration = false;
	}

	// Holds SetMeshOutputsEXT information. Threadgroup since first thread wins.
	if (processing_entry_point && is_mesh_shader())
		statement("threadgroup uint2 spvMeshSizes;");
}